

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.h
# Opt level: O3

ostream * MinVR::operator<<(ostream *os,VRDisplayNode *p)

{
  ostream *poVar1;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  VRDisplayNode::printNode(&local_60,p,&local_40);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_60._M_dataplus._M_p,local_60._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return poVar1;
}

Assistant:

std::ostream & operator<<(std::ostream &os, const VRDisplayNode& p) {
    return os << p.printNode("");
  }